

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManDumpAll(If_DsdMan_t *p,int Support)

{
  int iVar1;
  FILE *__stream;
  If_DsdObj_t *pObj_00;
  word *pTruth;
  int local_6c;
  FILE *pFile;
  int i;
  word *pRes;
  If_DsdObj_t *pObj;
  char *pFileName;
  int Support_local;
  If_DsdMan_t *p_local;
  
  __stream = fopen("tts_all.txt","wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n","tts_all.txt");
  }
  else {
    for (pFile._4_4_ = 0; iVar1 = Vec_PtrSize(&p->vObjs), pFile._4_4_ < iVar1;
        pFile._4_4_ = pFile._4_4_ + 1) {
      pObj_00 = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,pFile._4_4_);
      if ((Support == 0) || (iVar1 = If_DsdObjSuppSize(pObj_00), Support == iVar1)) {
        iVar1 = Abc_Var2Lit(pFile._4_4_,0);
        pTruth = If_DsdManComputeTruth(p,iVar1,(uchar *)0x0);
        fprintf(__stream,"0x");
        if (Support == 0) {
          local_6c = p->nVars;
        }
        else {
          local_6c = Abc_MaxInt(Support,6);
        }
        Abc_TtPrintHexRev((FILE *)__stream,pTruth,local_6c);
        fprintf(__stream,"\n");
      }
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void If_DsdManDumpAll( If_DsdMan_t * p, int Support )
{
    extern word * If_DsdManComputeTruth( If_DsdMan_t * p, int iDsd, unsigned char * pPermLits );
    char * pFileName = "tts_all.txt";
    If_DsdObj_t * pObj;
    word * pRes; int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        if ( Support && Support != If_DsdObjSuppSize(pObj) )
            continue;
        pRes = If_DsdManComputeTruth( p, Abc_Var2Lit(i, 0), NULL );
        fprintf( pFile, "0x" );
        Abc_TtPrintHexRev( pFile, pRes, Support ? Abc_MaxInt(Support, 6) : p->nVars );
        fprintf( pFile, "\n" );
//        printf( "    " );
//        Dau_DsdPrintFromTruth( pRes, p->nVars );
    }
    fclose( pFile );
}